

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O2

voidpf ft_gzip_alloc(voidpf opaque,uInt items,uInt size)

{
  FT_Pointer pvVar1;
  FT_Error error;
  FT_Error local_4;
  
  pvVar1 = ft_mem_alloc((FT_Memory)opaque,(ulong)items * (ulong)size,&local_4);
  return pvVar1;
}

Assistant:

static voidpf
  ft_gzip_alloc( voidpf  opaque,
                 uInt    items,
                 uInt    size )
  {
    FT_Memory   memory = (FT_Memory)opaque;
    FT_ULong    sz     = (FT_ULong)size * items;
    FT_Error    error;
    FT_Pointer  p      = NULL;


    /* allocate and zero out */
    FT_MEM_ALLOC( p, sz );
    return p;
  }